

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::removeViewItems(QTreeViewPrivate *this,int pos,int count)

{
  long lVar1;
  pointer pQVar2;
  int *piVar3;
  char *__filename;
  
  __filename = (char *)(long)pos;
  QList<QTreeViewItem>::remove(&this->viewItems,__filename);
  pQVar2 = QList<QTreeViewItem>::data(&this->viewItems);
  lVar1 = (this->viewItems).d.size;
  piVar3 = &pQVar2[(long)__filename].parentItem;
  for (; (long)__filename < lVar1; __filename = __filename + 1) {
    if (pos <= *piVar3) {
      *piVar3 = *piVar3 - count;
    }
    piVar3 = piVar3 + 10;
  }
  return;
}

Assistant:

void QTreeViewPrivate::removeViewItems(int pos, int count)
{
    viewItems.remove(pos, count);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem -= count;
}